

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack25_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  auVar6._8_8_ = *(undefined8 *)(in + 2);
  auVar6._0_8_ = *(undefined8 *)(in + 2);
  auVar8._8_4_ = 0x1ffffff;
  auVar8._0_8_ = 0x1ffffff01ffffff;
  auVar8._12_4_ = 0x1ffffff;
  uVar1 = in[1];
  auVar5 = *(undefined1 (*) [16])in;
  auVar7 = vpsrlvd_avx2(auVar5,_DAT_001a0a00);
  *out = *in & 0x1ffffff;
  uVar2 = in[6];
  auVar6 = vpshufd_avx(auVar6,0x50);
  auVar6 = vpsllvd_avx2(auVar6,_DAT_001a0a10);
  auVar4 = vpinsrd_avx(auVar8,(uVar1 & 0x3ffff) << 7,0);
  uVar3 = *(ulong *)(in + 4);
  auVar6 = vpand_avx(auVar6,_DAT_001a0a20);
  auVar6 = vpblendd_avx2(auVar6,auVar4,1);
  auVar4 = vpor_avx(auVar7,auVar6);
  auVar6 = vpand_avx(auVar7,auVar8);
  auVar6 = vpblendd_avx2(auVar4,auVar6,8);
  *(undefined1 (*) [16])(out + 1) = auVar6;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar3;
  auVar5 = vpalignr_avx(auVar7,auVar5,0xc);
  auVar6 = vpsrlvd_avx2(auVar5,_DAT_001a0a30);
  auVar5 = vpsllvd_avx2(auVar7,_DAT_001a0a40);
  auVar4._8_8_ = 0x1fffc0001fffff8;
  auVar4._0_8_ = 0x1fffc0001fffff8;
  auVar5 = vpternlogq_avx512vl(auVar5,auVar6,auVar4,0xec);
  *(long *)(out + 5) = auVar5._0_8_;
  out[7] = (uVar2 & 0xff) << 0x11 | (uint)(uVar3 >> 0x2f);
  return in + 7;
}

Assistant:

const uint32_t *__fastunpack25_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 25);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 18)) << (25 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 11)) << (25 - 11);
  out++;
  *out = ((*in) >> 11);
  ++in;
  *out |= ((*in) % (1U << 4)) << (25 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 25);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 22)) << (25 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 15)) << (25 - 15);
  out++;
  *out = ((*in) >> 15);
  ++in;
  *out |= ((*in) % (1U << 8)) << (25 - 8);
  out++;

  return in + 1;
}